

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<std::vector<int,_std::allocator<int>_>_>::load(BinaryBuffer *bb,Vector *v)

{
  vector<int,_std::allocator<int>_> *in_RSI;
  int *in_RDI;
  value_type_conflict *unaff_retaddr;
  size_type in_stack_00000008;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar1;
  undefined8 local_18;
  
  load<unsigned_long>((BinaryBuffer *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
  uVar1 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)s,in_stack_00000008,unaff_retaddr);
  if (local_18 != 0) {
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,0);
    load<int>((BinaryBuffer *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_RDI,0x130729);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }